

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

ExprBase * AnalyzeArrayIndex(ExpressionContext *ctx,SynTypeArray *syntax)

{
  int iVar1;
  undefined4 extraout_var;
  SynArrayIndex *syntax_00;
  ExprBase *pEVar2;
  SynBase *el;
  SynBase *pSVar3;
  SynArrayIndex *pSVar4;
  IntrusiveList<SynCallArgument> arguments;
  IntrusiveList<SynCallArgument> local_58;
  SynCallArgument *local_48;
  SynCallArgument *pSStack_40;
  SynCallArgument *node;
  undefined4 extraout_var_00;
  
  pSVar3 = (syntax->sizes).head;
  if (pSVar3 != (SynBase *)0x0) {
    pSVar4 = (SynArrayIndex *)0x0;
    do {
      local_58.head = (SynCallArgument *)0x0;
      local_58.tail = (SynCallArgument *)0x0;
      if (pSVar3->typeID != 3) {
        iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
        node = (SynCallArgument *)CONCAT44(extraout_var,iVar1);
        SynBase::SynBase((SynBase *)node,0x18,pSVar3->begin,pSVar3->end);
        (node->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003e6a20;
        node->name = (SynIdentifier *)0x0;
        node->value = pSVar3;
        IntrusiveList<SynCallArgument>::push_back(&local_58,node);
      }
      iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x58);
      syntax_00 = (SynArrayIndex *)CONCAT44(extraout_var_00,iVar1);
      if (pSVar4 == (SynArrayIndex *)0x0) {
        pSVar4 = (SynArrayIndex *)syntax->type;
      }
      local_48 = local_58.head;
      pSStack_40 = local_58.tail;
      SynBase::SynBase((SynBase *)syntax_00,0x19,pSVar3->begin,pSVar3->end);
      (syntax_00->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003e6a58;
      syntax_00->value = &pSVar4->super_SynBase;
      (syntax_00->arguments).head = local_48;
      (syntax_00->arguments).tail = pSStack_40;
      pSVar3 = pSVar3->next;
      pSVar4 = syntax_00;
    } while (pSVar3 != (SynBase *)0x0);
    pEVar2 = AnalyzeArrayIndex(ctx,syntax_00);
    return pEVar2;
  }
  __assert_fail("syntax->sizes.head",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                ,0x159b,"ExprBase *AnalyzeArrayIndex(ExpressionContext &, SynTypeArray *)");
}

Assistant:

ExprBase* AnalyzeArrayIndex(ExpressionContext &ctx, SynTypeArray *syntax)
{
	assert(syntax->sizes.head);

	SynArrayIndex *value = NULL;

	// Convert to a chain of SynArrayIndex
	for(SynBase *el = syntax->sizes.head; el; el = el->next)
	{
		IntrusiveList<SynCallArgument> arguments;

		if(!isType<SynNothing>(el))
			arguments.push_back(new (ctx.get<SynCallArgument>()) SynCallArgument(el->begin, el->end, NULL, el));

		value = new (ctx.get<SynArrayIndex>()) SynArrayIndex(el->begin, el->end, value ? value : syntax->type, arguments);
	}

	return AnalyzeArrayIndex(ctx, value);
}